

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

void __thiscall
chaiscript::detail::Dispatch_Engine::save_function_params
          (Dispatch_Engine *this,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *t_params)

{
  Stack_Holder *t_s;
  
  t_s = threading::Thread_Storage<chaiscript::detail::Stack_Holder>::operator*
                  (&this->m_stack_holder);
  save_function_params(t_s,t_params);
  return;
}

Assistant:

void save_function_params(std::vector<Boxed_Value> &&t_params) { save_function_params(*m_stack_holder, std::move(t_params)); }